

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O0

void __thiscall OpenMD::Snapshot::setHmat(Snapshot *this,Mat3x3d *m)

{
  double *pdVar1;
  SquareMatrix3<double> *in_RDI;
  int j;
  int i;
  RealType tol;
  RealType smallDiag;
  bool oldOrthoRhombic;
  SquareMatrix3<double> *in_stack_ffffffffffffff58;
  double dVar2;
  SquareMatrix3<double> *in_stack_ffffffffffffff60;
  uint local_80;
  uint local_7c;
  double local_70;
  SquareMatrix3<double> *this_00;
  
  *(undefined1 *)
   ((long)in_RDI[0x25].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
   0x15) = 0;
  this_00 = in_RDI;
  SquareMatrix3<double>::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  SquareMatrix3<double>::inverse(this_00);
  SquareMatrix3<double>::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x24565a);
  pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                     ((RectMatrix<double,_3U,_3U> *)
                      (in_RDI[0x12].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[2] + 2),0,0);
  local_70 = ABS(*pdVar1);
  dVar2 = local_70;
  pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                     ((RectMatrix<double,_3U,_3U> *)
                      (in_RDI[0x12].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[2] + 2),1,1);
  if (ABS(*pdVar1) < dVar2) {
    pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)
                        (in_RDI[0x12].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                         .data_[2] + 2),1,1);
    local_70 = ABS(*pdVar1);
  }
  dVar2 = local_70;
  pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                     ((RectMatrix<double,_3U,_3U> *)
                      (in_RDI[0x12].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[2] + 2),2,2);
  if (ABS(*pdVar1) < dVar2) {
    pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)
                        (in_RDI[0x12].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                         .data_[2] + 2),2,2);
    local_70 = ABS(*pdVar1);
  }
  dVar2 = in_RDI[0x25].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2];
  *(undefined1 *)
   ((long)in_RDI[0x16].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2] +
   0x11) = 1;
  for (local_7c = 0; (int)local_7c < 3; local_7c = local_7c + 1) {
    for (local_80 = 0; (int)local_80 < 3; local_80 = local_80 + 1) {
      if (((local_7c != local_80) &&
          ((*(byte *)((long)in_RDI[0x16].super_SquareMatrix<double,_3>.
                            super_RectMatrix<double,_3U,_3U>.data_[2] + 0x11) & 1) != 0)) &&
         (pdVar1 = RectMatrix<double,_3U,_3U>::operator()
                             ((RectMatrix<double,_3U,_3U> *)
                              (in_RDI[0x12].super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[2] + 2),local_7c,local_80),
         local_70 * dVar2 <= ABS(*pdVar1))) {
        *(undefined1 *)
         ((long)in_RDI[0x16].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
         + 0x11) = 0;
      }
    }
  }
  return;
}

Assistant:

void Snapshot::setHmat(const Mat3x3d& m) {
    hasVolume         = false;
    frameData.hmat    = m;
    frameData.invHmat = frameData.hmat.inverse();

    // determine whether the box is orthoTolerance or not
    bool oldOrthoRhombic = frameData.orthoRhombic;

    RealType smallDiag = fabs(frameData.hmat(0, 0));
    if (smallDiag > fabs(frameData.hmat(1, 1)))
      smallDiag = fabs(frameData.hmat(1, 1));
    if (smallDiag > fabs(frameData.hmat(2, 2)))
      smallDiag = fabs(frameData.hmat(2, 2));
    RealType tol = smallDiag * orthoTolerance_;

    frameData.orthoRhombic = true;

    for (int i = 0; i < 3; i++) {
      for (int j = 0; j < 3; j++) {
        if (i != j) {
          if (frameData.orthoRhombic) {
            if (fabs(frameData.hmat(i, j)) >= tol)
              frameData.orthoRhombic = false;
          }
        }
      }
    }

    if (oldOrthoRhombic != frameData.orthoRhombic) {
      // It is finally time to suppress these warnings once and for
      // all.  They were annoying and not very informative.

      // if( frameData.orthoRhombic ) {
      //   snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
      //   	 "OpenMD is switching from the default Non-Orthorhombic\n"
      //   	 "\tto the faster Orthorhombic periodic boundary
      //   computations.\n"
      //   	 "\tThis is usually a good thing, but if you want the\n"
      //   	 "\tNon-Orthorhombic computations, make the orthoBoxTolerance\n"
      //   	 "\tvariable ( currently set to %G ) smaller.\n",
      //   	 orthoTolerance_);
      //   painCave.severity = OPENMD_INFO;
      //   simError();
      // }
      // else {
      //   snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
      //   	 "OpenMD is switching from the faster Orthorhombic to the
      //   more\n"
      //   	 "\tflexible Non-Orthorhombic periodic boundary computations.\n"
      //   	 "\tThis is usually because the box has deformed under\n"
      //   	 "\tNPTf integration. If you want to live on the edge with\n"
      //   	 "\tthe Orthorhombic computations, make the orthoBoxTolerance\n"
      //   	 "\tvariable ( currently set to %G ) larger.\n",
      //   	 orthoTolerance_);
      //   painCave.severity = OPENMD_WARNING;
      //   simError();
      // }
    }
  }